

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml.c
# Opt level: O0

PyObject * libxml_xmlTextReaderGetErrorHandler(PyObject *self,PyObject *args)

{
  int iVar1;
  PyObject *pPVar2;
  xmlTextReaderPyCtxtPtr local_58;
  PyObject *py_retval;
  PyObject *pyobj_reader;
  void *arg;
  xmlTextReaderErrorFunc f;
  xmlTextReaderPyCtxtPtr pyCtxt;
  xmlTextReaderPtr reader;
  PyObject *args_local;
  PyObject *self_local;
  
  reader = (xmlTextReaderPtr)args;
  args_local = self;
  iVar1 = _PyArg_ParseTuple_SizeT(args,"O:xmlTextReaderSetErrorHandler",&py_retval);
  if (iVar1 == 0) {
    self_local = (PyObject *)0x0;
  }
  else {
    if (py_retval == (PyObject *)&_Py_NoneStruct) {
      local_58 = (xmlTextReaderPyCtxtPtr)0x0;
    }
    else {
      local_58 = (xmlTextReaderPyCtxtPtr)py_retval[1].ob_refcnt;
    }
    pyCtxt = local_58;
    xmlTextReaderGetErrorHandler(local_58,&arg,&pyobj_reader);
    pPVar2 = (PyObject *)PyTuple_New(2);
    self_local = pPVar2;
    if ((code *)arg == libxml_xmlTextReaderErrorCallback) {
      f = (xmlTextReaderErrorFunc)pyobj_reader;
      PyTuple_SetItem(pPVar2,0,pyobj_reader->ob_refcnt);
      _Py_XINCREF(*(PyObject **)f);
      PyTuple_SetItem(pPVar2,1,*(undefined8 *)(f + 8));
      _Py_XINCREF(*(PyObject **)(f + 8));
    }
    else {
      PyTuple_SetItem(pPVar2,0,&_Py_NoneStruct);
      _Py_XINCREF((PyObject *)&_Py_NoneStruct);
      PyTuple_SetItem(pPVar2,1,&_Py_NoneStruct);
      _Py_XINCREF((PyObject *)&_Py_NoneStruct);
    }
  }
  return self_local;
}

Assistant:

static PyObject *
libxml_xmlTextReaderGetErrorHandler(ATTRIBUTE_UNUSED PyObject *self, PyObject *args)
{
    xmlTextReaderPtr reader;
    xmlTextReaderPyCtxtPtr pyCtxt;
    xmlTextReaderErrorFunc f;
    void *arg;
    PyObject *pyobj_reader;
    PyObject *py_retval;

    if (!PyArg_ParseTuple(args, (char *)"O:xmlTextReaderSetErrorHandler", &pyobj_reader))
        return(NULL);
    reader = (xmlTextReaderPtr) PyxmlTextReader_Get(pyobj_reader);
    xmlTextReaderGetErrorHandler(reader,&f,&arg);
    py_retval = PyTuple_New(2);
    if (f == (xmlTextReaderErrorFunc)libxml_xmlTextReaderErrorCallback) {
	/* ok, it's our error handler! */
	pyCtxt = (xmlTextReaderPyCtxtPtr)arg;
	PyTuple_SetItem(py_retval, 0, pyCtxt->f);
	Py_XINCREF(pyCtxt->f);
	PyTuple_SetItem(py_retval, 1, pyCtxt->arg);
	Py_XINCREF(pyCtxt->arg);
    }
    else
    {
	/* f is null or it's not our error handler */
	PyTuple_SetItem(py_retval, 0, Py_None);
	Py_XINCREF(Py_None);
	PyTuple_SetItem(py_retval, 1, Py_None);
	Py_XINCREF(Py_None);
    }
    return(py_retval);
}